

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_initialize_syminfo
              (backtrace_state *state,libbacktrace_base_address base_address,uchar *symtab_data,
              size_t symtab_size,uchar *strtab,size_t strtab_size,
              backtrace_error_callback error_callback,void *data,elf_syminfo_data *sdata,
              elf_ppc64_opd_data *opd)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  short *psVar4;
  elf_symbol *p;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  size_t count;
  ulong *puVar8;
  
  uVar7 = symtab_size / 0x18;
  iVar3 = 0;
  if (symtab_size < 0x18) {
    count = 0;
  }
  else {
    psVar4 = (short *)(symtab_data + 6);
    count = 0;
    uVar5 = uVar7;
    do {
      if ((byte)((*(byte *)(psVar4 + -1) & 0xf) - 1) < 2) {
        count = (count + 1) - (ulong)(*psVar4 == 0);
      }
      psVar4 = psVar4 + 0xc;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  p = (elf_symbol *)tcmalloc_backtrace_alloc(state,count * 0x18,error_callback,data);
  if (p != (elf_symbol *)0x0) {
    if (0x17 < symtab_size) {
      puVar8 = (ulong *)(symtab_data + 8);
      uVar5 = 0;
      do {
        iVar3 = 7;
        if ((0xfd < (byte)((*(byte *)((long)puVar8 + -4) & 0xf) - 3)) &&
           (*(short *)((long)puVar8 + -2) != 0)) {
          if ((uint)puVar8[-1] < strtab_size) {
            p[uVar5].name = (char *)(strtab + (uint)puVar8[-1]);
            puVar6 = puVar8;
            if (opd != (elf_ppc64_opd_data *)0x0) {
              uVar1 = *puVar8;
              uVar2 = opd->addr;
              if ((uVar2 <= uVar1) && (uVar1 < uVar2 + opd->size)) {
                puVar6 = (ulong *)(opd->data + (uVar1 - uVar2));
              }
            }
            p[uVar5].address = *puVar6 + base_address.m;
            p[uVar5].size = puVar8[1];
            uVar5 = (ulong)((int)uVar5 + 1);
            iVar3 = 0;
          }
          else {
            (*error_callback)(data,"symbol string index out of range",0);
            tcmalloc_backtrace_free(state,p,count * 0x18,error_callback,data);
            iVar3 = 1;
          }
        }
        if ((iVar3 != 7) && (iVar3 != 0)) {
          return 0;
        }
        puVar8 = puVar8 + 3;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    tcmalloc_backtrace_qsort(p,count,0x18,elf_symbol_compare);
    sdata->next = (elf_syminfo_data *)0x0;
    sdata->symbols = p;
    sdata->count = count;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
elf_initialize_syminfo (struct backtrace_state *state,
			struct libbacktrace_base_address base_address,
			const unsigned char *symtab_data, size_t symtab_size,
			const unsigned char *strtab, size_t strtab_size,
			backtrace_error_callback error_callback,
			void *data, struct elf_syminfo_data *sdata,
			struct elf_ppc64_opd_data *opd)
{
  size_t sym_count;
  const b_elf_sym *sym;
  size_t elf_symbol_count;
  size_t elf_symbol_size;
  struct elf_symbol *elf_symbols;
  size_t i;
  unsigned int j;

  sym_count = symtab_size / sizeof (b_elf_sym);

  /* We only care about function symbols.  Count them.  */
  sym = (const b_elf_sym *) symtab_data;
  elf_symbol_count = 0;
  for (i = 0; i < sym_count; ++i, ++sym)
    {
      int info;

      info = sym->st_info & 0xf;
      if ((info == STT_FUNC || info == STT_OBJECT)
	  && sym->st_shndx != SHN_UNDEF)
	++elf_symbol_count;
    }

  elf_symbol_size = elf_symbol_count * sizeof (struct elf_symbol);
  elf_symbols = ((struct elf_symbol *)
		 backtrace_alloc (state, elf_symbol_size, error_callback,
				  data));
  if (elf_symbols == NULL)
    return 0;

  sym = (const b_elf_sym *) symtab_data;
  j = 0;
  for (i = 0; i < sym_count; ++i, ++sym)
    {
      int info;

      info = sym->st_info & 0xf;
      if (info != STT_FUNC && info != STT_OBJECT)
	continue;
      if (sym->st_shndx == SHN_UNDEF)
	continue;
      if (sym->st_name >= strtab_size)
	{
	  error_callback (data, "symbol string index out of range", 0);
	  backtrace_free (state, elf_symbols, elf_symbol_size, error_callback,
			  data);
	  return 0;
	}
      elf_symbols[j].name = (const char *) strtab + sym->st_name;
      /* Special case PowerPC64 ELFv1 symbols in .opd section, if the symbol
	 is a function descriptor, read the actual code address from the
	 descriptor.  */
      if (opd
	  && sym->st_value >= opd->addr
	  && sym->st_value < opd->addr + opd->size)
	elf_symbols[j].address
	  = *(const b_elf_addr *) (opd->data + (sym->st_value - opd->addr));
      else
	elf_symbols[j].address = sym->st_value;
      elf_symbols[j].address =
	libbacktrace_add_base (elf_symbols[j].address, base_address);
      elf_symbols[j].size = sym->st_size;
      ++j;
    }

  backtrace_qsort (elf_symbols, elf_symbol_count, sizeof (struct elf_symbol),
		   elf_symbol_compare);

  sdata->next = NULL;
  sdata->symbols = elf_symbols;
  sdata->count = elf_symbol_count;

  return 1;
}